

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  uint64_t uVar1;
  uint uVar2;
  int iVar3;
  TValue *in_RAX;
  long lVar4;
  cTValue *pcVar5;
  cTValue *o1_00;
  cTValue *o2_00;
  TValue *pTVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  code *pcVar10;
  MMS mm;
  TValue *pTVar11;
  TValue *local_38;
  
  pTVar11 = (TValue *)(ulong)(uint)op;
  uVar9 = o1->u64;
  lVar4 = (long)uVar9 >> 0x2f;
  if (lVar4 != -0xb) {
    lVar8 = o2->it64 >> 0x2f;
    if (lVar8 != -0xb) {
      local_38 = in_RAX;
      if (lVar4 == lVar8) {
        if (lVar8 == -5 && lVar4 == -5) {
          uVar2 = lj_str_cmp((GCstr *)(uVar9 & 0x7fffffffffff),(GCstr *)(o2->it64 & 0x7fffffffffff))
          ;
          uVar7 = (uint)((int)uVar2 < 1);
          if ((op & 2U) == 0) {
            uVar7 = uVar2 >> 0x1f;
          }
          return (TValue *)(ulong)(op & 1U ^ uVar7);
        }
      }
      else if (1 < (lVar8 + 3U | lVar4 + 3U)) goto LAB_00113ea8;
      do {
        mm = MM_le - (((ulong)pTVar11 & 2) == 0);
        o1_00 = lj_meta_lookup(L,o1,mm);
        o2_00 = lj_meta_lookup(L,o2,mm);
        pcVar5 = o1;
        if ((o1_00->u64 == 0xffffffffffffffff) || (iVar3 = lj_obj_equal(o1_00,o2_00), iVar3 == 0)) {
          iVar3 = 2;
          if (((ulong)pTVar11 & 2) != 0) {
            pTVar11 = (TValue *)(ulong)((uint)pTVar11 ^ 3);
            iVar3 = 4;
            pcVar5 = o2;
            o2 = o1;
          }
        }
        else {
          uVar9 = L->base[-2].u64 & 0x7fffffffffff;
          if (*(char *)(uVar9 + 10) == '\0') {
            pTVar6 = L->base + *(byte *)(*(long *)(uVar9 + 0x20) + -0x5d);
          }
          else {
            pTVar6 = L->top;
          }
          pcVar10 = lj_cont_condf;
          if (((ulong)pTVar11 & 1) == 0) {
            pcVar10 = lj_cont_condt;
          }
          pTVar6->n = (lua_Number)pcVar10;
          pTVar6[1].u64 = 0xffffffffffffffff;
          pTVar6[2] = *o1_00;
          local_38 = pTVar6 + 4;
          pTVar6[3].u64 = 0xffffffffffffffff;
          pTVar6[4] = *o1;
          pTVar6[5] = *o2;
          iVar3 = 1;
        }
        o1 = pcVar5;
      } while (iVar3 == 4);
      if (iVar3 == 1) {
        return local_38;
      }
      goto LAB_00113ea8;
    }
  }
  pcVar5 = o2;
  if ((uint)(uVar9 >> 0x2f) == 0x1fff5) {
    pcVar5 = o1;
  }
  pcVar5 = lj_meta_lookup(L,pcVar5,MM_le - ((op & 2U) == 0));
  uVar1 = pcVar5->u64;
  if (uVar1 != 0xffffffffffffffff) {
    uVar9 = L->base[-2].u64 & 0x7fffffffffff;
    if (*(char *)(uVar9 + 10) == '\0') {
      pTVar6 = L->base + *(byte *)(*(long *)(uVar9 + 0x20) + -0x5d);
    }
    else {
      pTVar6 = L->top;
    }
    pcVar10 = lj_cont_condf;
    if ((op & 1U) == 0) {
      pcVar10 = lj_cont_condt;
    }
    pTVar6->n = (lua_Number)pcVar10;
    pTVar6[1].u64 = 0xffffffffffffffff;
    pTVar6[2] = *pcVar5;
    pTVar11 = pTVar6 + 4;
    pTVar6[3].u64 = 0xffffffffffffffff;
    pTVar6[4] = *o1;
    pTVar6[5] = *o2;
  }
  if (uVar1 != 0xffffffffffffffff) {
    return pTVar11;
  }
LAB_00113ea8:
  lj_err_comp(L,o1,o2);
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}